

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  Scene *pSVar5;
  Ref<embree::Geometry> *pRVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  uint uVar38;
  AABBNodeMB4D *node1;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  int iVar42;
  ulong uVar44;
  undefined1 (*pauVar45) [16];
  long lVar46;
  ulong uVar47;
  undefined1 (*pauVar48) [16];
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  Geometry *pGVar59;
  ulong uVar60;
  ulong uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar63 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar98;
  float fVar103;
  float fVar104;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar120 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar134;
  float fVar135;
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [32];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined4 uVar148;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar162 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2a20 [16];
  undefined1 (*local_2a10) [16];
  ulong local_2a08;
  long local_2a00;
  ulong local_29f8;
  ulong local_29f0;
  long local_29e8;
  ulong local_29e0;
  ulong local_29d8;
  long local_29d0;
  ulong local_29c8;
  undefined1 local_29c0 [32];
  RTCFilterFunctionNArguments local_2990;
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  float local_28c0;
  float fStack_28bc;
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  undefined4 uStack_28a4;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  RTCHitN local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined4 local_2730;
  undefined4 uStack_272c;
  undefined4 uStack_2728;
  undefined4 uStack_2724;
  undefined4 local_2720;
  undefined4 uStack_271c;
  undefined4 uStack_2718;
  undefined4 uStack_2714;
  uint local_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [32];
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar43;
  
  pauVar48 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar148 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23e0._4_4_ = uVar148;
  local_23e0._0_4_ = uVar148;
  local_23e0._8_4_ = uVar148;
  local_23e0._12_4_ = uVar148;
  local_23e0._16_4_ = uVar148;
  local_23e0._20_4_ = uVar148;
  local_23e0._24_4_ = uVar148;
  local_23e0._28_4_ = uVar148;
  auVar115 = ZEXT3264(local_23e0);
  uVar148 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2400._4_4_ = uVar148;
  local_2400._0_4_ = uVar148;
  local_2400._8_4_ = uVar148;
  local_2400._12_4_ = uVar148;
  local_2400._16_4_ = uVar148;
  local_2400._20_4_ = uVar148;
  local_2400._24_4_ = uVar148;
  local_2400._28_4_ = uVar148;
  auVar120 = ZEXT3264(local_2400);
  uVar148 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2420._4_4_ = uVar148;
  local_2420._0_4_ = uVar148;
  local_2420._8_4_ = uVar148;
  local_2420._12_4_ = uVar148;
  local_2420._16_4_ = uVar148;
  local_2420._20_4_ = uVar148;
  local_2420._24_4_ = uVar148;
  local_2420._28_4_ = uVar148;
  auVar130 = ZEXT3264(local_2420);
  fVar146 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar157 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar161 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar131 = fVar146 * 0.99999964;
  fVar136 = fVar157 * 0.99999964;
  fVar141 = fVar161 * 0.99999964;
  fVar146 = fVar146 * 1.0000004;
  fVar157 = fVar157 * 1.0000004;
  fVar161 = fVar161 * 1.0000004;
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_29c8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar61 = uVar58 ^ 0x20;
  uVar60 = local_29c8 ^ 0x20;
  iVar42 = (tray->tnear).field_0.i[k];
  local_2920._4_4_ = iVar42;
  local_2920._0_4_ = iVar42;
  local_2920._8_4_ = iVar42;
  local_2920._12_4_ = iVar42;
  local_2920._16_4_ = iVar42;
  local_2920._20_4_ = iVar42;
  local_2920._24_4_ = iVar42;
  local_2920._28_4_ = iVar42;
  auVar112 = ZEXT3264(local_2920);
  iVar42 = (tray->tfar).field_0.i[k];
  auVar67 = ZEXT3264(CONCAT428(iVar42,CONCAT424(iVar42,CONCAT420(iVar42,CONCAT416(iVar42,CONCAT412(
                                                  iVar42,CONCAT48(iVar42,CONCAT44(iVar42,iVar42)))))
                                               )));
  local_2500._16_16_ = mm_lookupmask_ps._240_16_;
  local_2500._0_16_ = mm_lookupmask_ps._0_16_;
  local_2a10 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar71._8_4_ = 0xbf800000;
  auVar71._0_8_ = 0xbf800000bf800000;
  auVar71._12_4_ = 0xbf800000;
  auVar71._16_4_ = 0xbf800000;
  auVar71._20_4_ = 0xbf800000;
  auVar71._24_4_ = 0xbf800000;
  auVar71._28_4_ = 0xbf800000;
  _local_2520 = vblendvps_avx(auVar88,auVar71,local_2500);
  local_2440 = fVar131;
  fStack_243c = fVar131;
  fStack_2438 = fVar131;
  fStack_2434 = fVar131;
  fStack_2430 = fVar131;
  fStack_242c = fVar131;
  fStack_2428 = fVar131;
  fStack_2424 = fVar131;
  local_2460 = fVar136;
  fStack_245c = fVar136;
  fStack_2458 = fVar136;
  fStack_2454 = fVar136;
  fStack_2450 = fVar136;
  fStack_244c = fVar136;
  fStack_2448 = fVar136;
  fStack_2444 = fVar136;
  local_2480 = fVar141;
  fStack_247c = fVar141;
  fStack_2478 = fVar141;
  fStack_2474 = fVar141;
  fStack_2470 = fVar141;
  fStack_246c = fVar141;
  fStack_2468 = fVar141;
  fStack_2464 = fVar141;
  local_24a0 = fVar146;
  fStack_249c = fVar146;
  fStack_2498 = fVar146;
  fStack_2494 = fVar146;
  fStack_2490 = fVar146;
  fStack_248c = fVar146;
  fStack_2488 = fVar146;
  fStack_2484 = fVar146;
  local_24c0 = fVar157;
  fStack_24bc = fVar157;
  fStack_24b8 = fVar157;
  fStack_24b4 = fVar157;
  fStack_24b0 = fVar157;
  fStack_24ac = fVar157;
  fStack_24a8 = fVar157;
  fStack_24a4 = fVar157;
  local_24e0 = fVar161;
  fStack_24dc = fVar161;
  fStack_24d8 = fVar161;
  fStack_24d4 = fVar161;
  fStack_24d0 = fVar161;
  fStack_24cc = fVar161;
  fStack_24c8 = fVar161;
  fStack_24c4 = fVar161;
  fVar134 = fVar131;
  fVar135 = fVar131;
  fVar98 = fVar131;
  fVar103 = fVar131;
  fVar104 = fVar131;
  fVar105 = fVar131;
  fVar106 = fVar136;
  fVar107 = fVar136;
  fVar108 = fVar136;
  fVar138 = fVar136;
  fVar139 = fVar136;
  fVar140 = fVar136;
  fVar142 = fVar141;
  fVar143 = fVar141;
  fVar144 = fVar141;
  fVar145 = fVar141;
  fVar116 = fVar141;
  fVar121 = fVar141;
  fVar122 = fVar146;
  fVar123 = fVar146;
  fVar124 = fVar146;
  fVar125 = fVar146;
  fVar126 = fVar146;
  fVar147 = fVar146;
  fVar151 = fVar157;
  fVar152 = fVar157;
  fVar153 = fVar157;
  fVar154 = fVar157;
  fVar155 = fVar157;
  fVar156 = fVar157;
  fVar164 = fVar161;
  fVar165 = fVar161;
  fVar166 = fVar161;
  fVar167 = fVar161;
  fVar168 = fVar161;
  fVar169 = fVar161;
  local_2a08 = uVar58;
LAB_016817fd:
  do {
    do {
      if (pauVar48 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar45 = pauVar48 + -1;
      pauVar48 = pauVar48 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar45 + 8));
    uVar47 = *(ulong *)*pauVar48;
    while ((uVar47 & 8) == 0) {
      uVar148 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar72._4_4_ = uVar148;
      auVar72._0_4_ = uVar148;
      auVar72._8_4_ = uVar148;
      auVar72._12_4_ = uVar148;
      auVar72._16_4_ = uVar148;
      auVar72._20_4_ = uVar148;
      auVar72._24_4_ = uVar148;
      auVar72._28_4_ = uVar148;
      uVar39 = uVar47 & 0xfffffffffffffff0;
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar58),auVar72,
                                *(undefined1 (*) [32])(uVar39 + 0x40 + uVar58));
      auVar71 = vsubps_avx(ZEXT1632(auVar68),auVar115._0_32_);
      auVar77._4_4_ = fVar134 * auVar71._4_4_;
      auVar77._0_4_ = fVar131 * auVar71._0_4_;
      auVar77._8_4_ = fVar135 * auVar71._8_4_;
      auVar77._12_4_ = fVar98 * auVar71._12_4_;
      auVar77._16_4_ = fVar103 * auVar71._16_4_;
      auVar77._20_4_ = fVar104 * auVar71._20_4_;
      auVar77._24_4_ = fVar105 * auVar71._24_4_;
      auVar77._28_4_ = auVar71._28_4_;
      auVar71 = vmaxps_avx(auVar112._0_32_,auVar77);
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar50),auVar72,
                                *(undefined1 (*) [32])(uVar39 + 0x40 + uVar50));
      auVar88 = vsubps_avx(ZEXT1632(auVar68),auVar120._0_32_);
      auVar10._4_4_ = fVar106 * auVar88._4_4_;
      auVar10._0_4_ = fVar136 * auVar88._0_4_;
      auVar10._8_4_ = fVar107 * auVar88._8_4_;
      auVar10._12_4_ = fVar108 * auVar88._12_4_;
      auVar10._16_4_ = fVar138 * auVar88._16_4_;
      auVar10._20_4_ = fVar139 * auVar88._20_4_;
      auVar10._24_4_ = fVar140 * auVar88._24_4_;
      auVar10._28_4_ = auVar88._28_4_;
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + local_29c8),auVar72,
                                *(undefined1 (*) [32])(uVar39 + 0x40 + local_29c8));
      auVar88 = vsubps_avx(ZEXT1632(auVar68),auVar130._0_32_);
      auVar11._4_4_ = fVar142 * auVar88._4_4_;
      auVar11._0_4_ = fVar141 * auVar88._0_4_;
      auVar11._8_4_ = fVar143 * auVar88._8_4_;
      auVar11._12_4_ = fVar144 * auVar88._12_4_;
      auVar11._16_4_ = fVar145 * auVar88._16_4_;
      auVar11._20_4_ = fVar116 * auVar88._20_4_;
      auVar11._24_4_ = fVar121 * auVar88._24_4_;
      auVar11._28_4_ = auVar88._28_4_;
      auVar88 = vmaxps_avx(auVar10,auVar11);
      local_26e0 = vmaxps_avx(auVar71,auVar88);
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar61),auVar72,
                                *(undefined1 (*) [32])(uVar39 + 0x40 + uVar61));
      auVar71 = vsubps_avx(ZEXT1632(auVar68),auVar115._0_32_);
      auVar12._4_4_ = fVar122 * auVar71._4_4_;
      auVar12._0_4_ = fVar146 * auVar71._0_4_;
      auVar12._8_4_ = fVar123 * auVar71._8_4_;
      auVar12._12_4_ = fVar124 * auVar71._12_4_;
      auVar12._16_4_ = fVar125 * auVar71._16_4_;
      auVar12._20_4_ = fVar126 * auVar71._20_4_;
      auVar12._24_4_ = fVar147 * auVar71._24_4_;
      auVar12._28_4_ = auVar71._28_4_;
      auVar71 = vminps_avx(auVar67._0_32_,auVar12);
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + (uVar50 ^ 0x20)),auVar72,
                                *(undefined1 (*) [32])(uVar39 + 0x40 + (uVar50 ^ 0x20)));
      auVar88 = vsubps_avx(ZEXT1632(auVar68),auVar120._0_32_);
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar60),auVar72,
                                *(undefined1 (*) [32])(uVar39 + 0x40 + uVar60));
      auVar13._4_4_ = fVar151 * auVar88._4_4_;
      auVar13._0_4_ = fVar157 * auVar88._0_4_;
      auVar13._8_4_ = fVar152 * auVar88._8_4_;
      auVar13._12_4_ = fVar153 * auVar88._12_4_;
      auVar13._16_4_ = fVar154 * auVar88._16_4_;
      auVar13._20_4_ = fVar155 * auVar88._20_4_;
      auVar13._24_4_ = fVar156 * auVar88._24_4_;
      auVar13._28_4_ = auVar88._28_4_;
      auVar88 = vsubps_avx(ZEXT1632(auVar68),auVar130._0_32_);
      auVar14._4_4_ = fVar164 * auVar88._4_4_;
      auVar14._0_4_ = fVar161 * auVar88._0_4_;
      auVar14._8_4_ = fVar165 * auVar88._8_4_;
      auVar14._12_4_ = fVar166 * auVar88._12_4_;
      auVar14._16_4_ = fVar167 * auVar88._16_4_;
      auVar14._20_4_ = fVar168 * auVar88._20_4_;
      auVar14._24_4_ = fVar169 * auVar88._24_4_;
      auVar14._28_4_ = auVar88._28_4_;
      auVar88 = vminps_avx(auVar13,auVar14);
      auVar71 = vminps_avx(auVar71,auVar88);
      auVar71 = vcmpps_avx(local_26e0,auVar71,2);
      if (((uint)uVar47 & 7) == 6) {
        auVar88 = vcmpps_avx(*(undefined1 (*) [32])(uVar39 + 0x1c0),auVar72,2);
        auVar77 = vcmpps_avx(auVar72,*(undefined1 (*) [32])(uVar39 + 0x1e0),1);
        auVar88 = vandps_avx(auVar88,auVar77);
        auVar71 = vandps_avx(auVar88,auVar71);
        auVar68 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
      }
      else {
        auVar68 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
      }
      auVar68 = vpsllw_avx(auVar68,0xf);
      if ((((((((auVar68 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar68 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar68 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar68 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar68 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar68 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar68 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar68[0xf])
      goto LAB_016817fd;
      auVar68 = vpacksswb_avx(auVar68,auVar68);
      bVar18 = SUB161(auVar68 >> 7,0) & 1 | (SUB161(auVar68 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar68 >> 0x17,0) & 1) << 2 | (SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar68 >> 0x27,0) & 1) << 4 | (SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar68 >> 0x37,0) & 1) << 6 | SUB161(auVar68 >> 0x3f,0) << 7;
      lVar40 = 0;
      for (uVar47 = (ulong)bVar18; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
        lVar40 = lVar40 + 1;
      }
      uVar47 = *(ulong *)(uVar39 + lVar40 * 8);
      uVar41 = bVar18 - 1 & (uint)bVar18;
      uVar43 = (ulong)uVar41;
      if (uVar41 != 0) {
        uVar38 = *(uint *)(local_26e0 + lVar40 * 4);
        lVar40 = 0;
        for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
          lVar40 = lVar40 + 1;
        }
        uVar41 = uVar41 - 1 & uVar41;
        uVar44 = (ulong)uVar41;
        uVar43 = *(ulong *)(uVar39 + lVar40 * 8);
        uVar4 = *(uint *)(local_26e0 + lVar40 * 4);
        if (uVar41 == 0) {
          if (uVar38 < uVar4) {
            *(ulong *)*pauVar48 = uVar43;
            *(uint *)(*pauVar48 + 8) = uVar4;
            pauVar48 = pauVar48 + 1;
          }
          else {
            *(ulong *)*pauVar48 = uVar47;
            *(uint *)(*pauVar48 + 8) = uVar38;
            pauVar48 = pauVar48 + 1;
            uVar47 = uVar43;
          }
        }
        else {
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar47;
          auVar68 = vpunpcklqdq_avx(auVar68,ZEXT416(uVar38));
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar43;
          auVar79 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar4));
          lVar40 = 0;
          for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
            lVar40 = lVar40 + 1;
          }
          uVar41 = uVar41 - 1 & uVar41;
          uVar47 = (ulong)uVar41;
          auVar86._8_8_ = 0;
          auVar86._0_8_ = *(ulong *)(uVar39 + lVar40 * 8);
          auVar69 = vpunpcklqdq_avx(auVar86,ZEXT416(*(uint *)(local_26e0 + lVar40 * 4)));
          auVar86 = vpcmpgtd_avx(auVar79,auVar68);
          if (uVar41 == 0) {
            auVar99 = vpshufd_avx(auVar86,0xaa);
            auVar86 = vblendvps_avx(auVar79,auVar68,auVar99);
            auVar68 = vblendvps_avx(auVar68,auVar79,auVar99);
            auVar79 = vpcmpgtd_avx(auVar69,auVar86);
            auVar99 = vpshufd_avx(auVar79,0xaa);
            auVar79 = vblendvps_avx(auVar69,auVar86,auVar99);
            auVar86 = vblendvps_avx(auVar86,auVar69,auVar99);
            auVar69 = vpcmpgtd_avx(auVar86,auVar68);
            auVar99 = vpshufd_avx(auVar69,0xaa);
            auVar69 = vblendvps_avx(auVar86,auVar68,auVar99);
            auVar68 = vblendvps_avx(auVar68,auVar86,auVar99);
            *pauVar48 = auVar68;
            pauVar48[1] = auVar69;
            uVar47 = auVar79._0_8_;
            pauVar48 = pauVar48 + 2;
          }
          else {
            lVar40 = 0;
            for (; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
              lVar40 = lVar40 + 1;
            }
            uVar41 = uVar41 - 1 & uVar41;
            uVar47 = (ulong)uVar41;
            auVar99._8_8_ = 0;
            auVar99._0_8_ = *(ulong *)(uVar39 + lVar40 * 8);
            auVar99 = vpunpcklqdq_avx(auVar99,ZEXT416(*(uint *)(local_26e0 + lVar40 * 4)));
            if (uVar41 == 0) {
              auVar80 = vpshufd_avx(auVar86,0xaa);
              auVar86 = vblendvps_avx(auVar79,auVar68,auVar80);
              auVar68 = vblendvps_avx(auVar68,auVar79,auVar80);
              auVar79 = vpcmpgtd_avx(auVar99,auVar69);
              auVar80 = vpshufd_avx(auVar79,0xaa);
              auVar79 = vblendvps_avx(auVar99,auVar69,auVar80);
              auVar69 = vblendvps_avx(auVar69,auVar99,auVar80);
              auVar99 = vpcmpgtd_avx(auVar69,auVar68);
              auVar80 = vpshufd_avx(auVar99,0xaa);
              auVar99 = vblendvps_avx(auVar69,auVar68,auVar80);
              auVar68 = vblendvps_avx(auVar68,auVar69,auVar80);
              auVar69 = vpcmpgtd_avx(auVar79,auVar86);
              auVar80 = vpshufd_avx(auVar69,0xaa);
              auVar69 = vblendvps_avx(auVar79,auVar86,auVar80);
              auVar79 = vblendvps_avx(auVar86,auVar79,auVar80);
              auVar86 = vpcmpgtd_avx(auVar99,auVar79);
              auVar80 = vpshufd_avx(auVar86,0xaa);
              auVar86 = vblendvps_avx(auVar99,auVar79,auVar80);
              auVar79 = vblendvps_avx(auVar79,auVar99,auVar80);
              *pauVar48 = auVar68;
              pauVar48[1] = auVar79;
              pauVar48[2] = auVar86;
              uVar47 = auVar69._0_8_;
              pauVar45 = pauVar48 + 3;
            }
            else {
              *pauVar48 = auVar68;
              pauVar48[1] = auVar79;
              pauVar48[2] = auVar69;
              pauVar45 = pauVar48 + 3;
              pauVar48[3] = auVar99;
              do {
                lVar40 = 0;
                for (uVar43 = uVar47; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000)
                {
                  lVar40 = lVar40 + 1;
                }
                auVar69._8_8_ = 0;
                auVar69._0_8_ = *(ulong *)(uVar39 + lVar40 * 8);
                auVar68 = vpunpcklqdq_avx(auVar69,ZEXT416(*(uint *)(local_26e0 + lVar40 * 4)));
                pauVar45[1] = auVar68;
                pauVar45 = pauVar45 + 1;
                uVar47 = uVar47 - 1 & uVar47;
              } while (uVar47 != 0);
              lVar40 = 0;
              while (pauVar45 != pauVar48) {
                auVar68 = pauVar48[1];
                uVar41 = vextractps_avx(auVar68,2);
                for (lVar49 = 0x10;
                    (lVar40 != lVar49 && (*(uint *)(pauVar48[-1] + lVar49 + 8) < uVar41));
                    lVar49 = lVar49 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar48 + lVar49) =
                       *(undefined1 (*) [16])(pauVar48[-1] + lVar49);
                }
                *(undefined1 (*) [16])(*pauVar48 + lVar49) = auVar68;
                lVar40 = lVar40 + -0x10;
                pauVar48 = pauVar48 + 1;
              }
              uVar47 = *(ulong *)*pauVar45;
            }
            auVar112 = ZEXT3264(local_2920);
            pauVar48 = pauVar45;
          }
        }
      }
    }
    local_2a00 = (ulong)((uint)uVar47 & 0xf) - 8;
    uVar47 = uVar47 & 0xfffffffffffffff0;
    for (local_29d0 = 0; local_29d0 != local_2a00; local_29d0 = local_29d0 + 1) {
      lVar49 = local_29d0 * 0x60;
      pSVar5 = context->scene;
      pRVar6 = (pSVar5->geometries).items;
      pGVar59 = pRVar6[*(uint *)(uVar47 + 0x40 + lVar49)].ptr;
      fVar146 = (pGVar59->time_range).lower;
      fVar146 = pGVar59->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar146) /
                ((pGVar59->time_range).upper - fVar146));
      auVar68 = vroundss_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),9);
      auVar68 = vminss_avx(auVar68,ZEXT416((uint)(pGVar59->fnumTimeSegments + -1.0)));
      auVar100 = vmaxss_avx(ZEXT816(0) << 0x20,auVar68);
      iVar42 = (int)auVar100._0_4_;
      lVar55 = (long)iVar42 * 0x38;
      lVar40 = *(long *)(*(long *)&pGVar59[2].numPrimitives + lVar55);
      uVar41 = *(uint *)(uVar47 + 4 + lVar49);
      auVar68 = *(undefined1 (*) [16])(lVar40 + (ulong)*(uint *)(uVar47 + lVar49) * 4);
      uVar39 = (ulong)*(uint *)(uVar47 + 0x10 + lVar49);
      auVar79 = *(undefined1 (*) [16])(lVar40 + uVar39 * 4);
      uVar43 = (ulong)*(uint *)(uVar47 + 0x20 + lVar49);
      auVar86 = *(undefined1 (*) [16])(lVar40 + uVar43 * 4);
      uVar44 = (ulong)*(uint *)(uVar47 + 0x30 + lVar49);
      auVar69 = *(undefined1 (*) [16])(lVar40 + uVar44 * 4);
      local_29e8 = *(long *)&pRVar6[*(uint *)(uVar47 + 0x44 + lVar49)].ptr[2].numPrimitives;
      lVar40 = *(long *)(local_29e8 + lVar55);
      auVar99 = *(undefined1 (*) [16])(lVar40 + (ulong)uVar41 * 4);
      uVar51 = (ulong)*(uint *)(uVar47 + 0x14 + lVar49);
      auVar80 = *(undefined1 (*) [16])(lVar40 + uVar51 * 4);
      uVar52 = (ulong)*(uint *)(uVar47 + 0x24 + lVar49);
      auVar63 = *(undefined1 (*) [16])(lVar40 + uVar52 * 4);
      uVar53 = (ulong)*(uint *)(uVar47 + 0x34 + lVar49);
      auVar62 = *(undefined1 (*) [16])(lVar40 + uVar53 * 4);
      lVar40 = *(long *)&pRVar6[*(uint *)(uVar47 + 0x48 + lVar49)].ptr[2].numPrimitives;
      lVar7 = *(long *)(lVar40 + lVar55);
      uVar54 = (ulong)*(uint *)(uVar47 + 8 + lVar49);
      auVar87 = *(undefined1 (*) [16])(lVar7 + uVar54 * 4);
      local_29e0 = (ulong)*(uint *)(uVar47 + 0x18 + lVar49);
      auVar162 = *(undefined1 (*) [16])(lVar7 + local_29e0 * 4);
      local_29d8 = (ulong)*(uint *)(uVar47 + 0x28 + lVar49);
      auVar2 = *(undefined1 (*) [16])(lVar7 + local_29d8 * 4);
      uVar57 = (ulong)*(uint *)(uVar47 + 0x38 + lVar49);
      auVar3 = *(undefined1 (*) [16])(lVar7 + uVar57 * 4);
      fVar146 = fVar146 - auVar100._0_4_;
      lVar7 = *(long *)&pRVar6[*(uint *)(uVar47 + 0x4c + lVar49)].ptr[2].numPrimitives;
      lVar55 = *(long *)(lVar7 + lVar55);
      uVar58 = (ulong)*(uint *)(uVar47 + 0xc + lVar49);
      auVar100 = *(undefined1 (*) [16])(lVar55 + uVar58 * 4);
      local_29f8 = (ulong)*(uint *)(uVar47 + 0x1c + lVar49);
      auVar113 = *(undefined1 (*) [16])(lVar55 + local_29f8 * 4);
      auVar117 = vunpcklps_avx(auVar68,auVar87);
      auVar87 = vunpckhps_avx(auVar68,auVar87);
      auVar127 = vunpcklps_avx(auVar99,auVar100);
      auVar99 = vunpckhps_avx(auVar99,auVar100);
      uVar56 = (ulong)*(uint *)(uVar47 + 0x2c + lVar49);
      auVar68 = *(undefined1 (*) [16])(lVar55 + uVar56 * 4);
      auVar100 = vunpcklps_avx(auVar87,auVar99);
      local_27b0 = vunpcklps_avx(auVar117,auVar127);
      auVar99 = vunpckhps_avx(auVar117,auVar127);
      auVar117 = vunpcklps_avx(auVar79,auVar162);
      auVar87 = vunpckhps_avx(auVar79,auVar162);
      auVar162 = vunpcklps_avx(auVar80,auVar113);
      auVar80 = vunpckhps_avx(auVar80,auVar113);
      local_29f0 = (ulong)*(uint *)(uVar47 + 0x3c + lVar49);
      auVar79 = *(undefined1 (*) [16])(lVar55 + local_29f0 * 4);
      auVar87 = vunpcklps_avx(auVar87,auVar80);
      auVar113 = vunpcklps_avx(auVar117,auVar162);
      auVar80 = vunpckhps_avx(auVar117,auVar162);
      auVar162 = vunpcklps_avx(auVar86,auVar2);
      auVar86 = vunpckhps_avx(auVar86,auVar2);
      auVar2 = vunpcklps_avx(auVar63,auVar68);
      auVar63 = vunpckhps_avx(auVar63,auVar68);
      lVar46 = (long)(iVar42 + 1) * 0x38;
      lVar55 = *(long *)(*(long *)&pGVar59[2].numPrimitives + lVar46);
      auVar68 = *(undefined1 (*) [16])(lVar55 + (ulong)*(uint *)(uVar47 + lVar49) * 4);
      auVar117 = vunpcklps_avx(auVar86,auVar63);
      auVar127 = vunpcklps_avx(auVar162,auVar2);
      local_27e0 = vunpckhps_avx(auVar162,auVar2);
      auVar63 = vunpcklps_avx(auVar69,auVar3);
      auVar86 = vunpckhps_avx(auVar69,auVar3);
      auVar162 = vunpcklps_avx(auVar62,auVar79);
      auVar69 = vunpckhps_avx(auVar62,auVar79);
      lVar40 = *(long *)(lVar40 + lVar46);
      auVar79 = *(undefined1 (*) [16])(lVar40 + uVar54 * 4);
      auVar2 = vunpcklps_avx(auVar86,auVar69);
      local_27c0 = vunpcklps_avx(auVar63,auVar162);
      local_27d0 = vunpckhps_avx(auVar63,auVar162);
      lVar8 = *(long *)(local_29e8 + lVar46);
      auVar69 = vunpcklps_avx(auVar68,auVar79);
      auVar86 = vunpckhps_avx(auVar68,auVar79);
      auVar68 = *(undefined1 (*) [16])(lVar8 + (ulong)uVar41 * 4);
      lVar7 = *(long *)(lVar7 + lVar46);
      auVar79 = *(undefined1 (*) [16])(lVar7 + uVar58 * 4);
      auVar63 = vunpcklps_avx(auVar68,auVar79);
      auVar68 = vunpckhps_avx(auVar68,auVar79);
      auVar162 = vunpcklps_avx(auVar86,auVar68);
      auVar3 = vunpcklps_avx(auVar69,auVar63);
      auVar86 = vunpckhps_avx(auVar69,auVar63);
      auVar68 = *(undefined1 (*) [16])(lVar55 + uVar39 * 4);
      auVar79 = *(undefined1 (*) [16])(lVar40 + local_29e0 * 4);
      auVar63 = vunpcklps_avx(auVar68,auVar79);
      auVar69 = vunpckhps_avx(auVar68,auVar79);
      auVar68 = *(undefined1 (*) [16])(lVar8 + uVar51 * 4);
      auVar79 = *(undefined1 (*) [16])(lVar7 + local_29f8 * 4);
      auVar62 = vunpcklps_avx(auVar68,auVar79);
      auVar68 = vunpckhps_avx(auVar68,auVar79);
      auVar132 = vunpcklps_avx(auVar69,auVar68);
      auVar15 = vunpcklps_avx(auVar63,auVar62);
      auVar69 = vunpckhps_avx(auVar63,auVar62);
      auVar68 = *(undefined1 (*) [16])(lVar55 + uVar43 * 4);
      auVar79 = *(undefined1 (*) [16])(lVar40 + local_29d8 * 4);
      auVar62 = vunpcklps_avx(auVar68,auVar79);
      auVar63 = vunpckhps_avx(auVar68,auVar79);
      auVar68 = *(undefined1 (*) [16])(lVar8 + uVar52 * 4);
      auVar79 = *(undefined1 (*) [16])(lVar7 + uVar56 * 4);
      auVar70 = vunpcklps_avx(auVar68,auVar79);
      auVar68 = vunpckhps_avx(auVar68,auVar79);
      auVar16 = vunpcklps_avx(auVar63,auVar68);
      auVar17 = vunpcklps_avx(auVar62,auVar70);
      auVar63 = vunpckhps_avx(auVar62,auVar70);
      auVar68 = *(undefined1 (*) [16])(lVar55 + uVar44 * 4);
      auVar79 = *(undefined1 (*) [16])(lVar40 + uVar57 * 4);
      auVar70 = vunpcklps_avx(auVar68,auVar79);
      auVar62 = vunpckhps_avx(auVar68,auVar79);
      auVar68 = *(undefined1 (*) [16])(lVar8 + uVar53 * 4);
      auVar79 = *(undefined1 (*) [16])(lVar7 + local_29f0 * 4);
      auVar92 = vunpcklps_avx(auVar68,auVar79);
      auVar68 = vunpckhps_avx(auVar68,auVar79);
      auVar79 = vunpcklps_avx(auVar62,auVar68);
      auVar62 = vunpcklps_avx(auVar70,auVar92);
      auVar68 = vunpckhps_avx(auVar70,auVar92);
      fVar157 = 1.0 - fVar146;
      auVar158._4_4_ = fVar157;
      auVar158._0_4_ = fVar157;
      auVar158._8_4_ = fVar157;
      auVar158._12_4_ = fVar157;
      auVar70._0_4_ = fVar146 * auVar3._0_4_;
      auVar70._4_4_ = fVar146 * auVar3._4_4_;
      auVar70._8_4_ = fVar146 * auVar3._8_4_;
      auVar70._12_4_ = fVar146 * auVar3._12_4_;
      auVar3 = vfmadd231ps_fma(auVar70,auVar158,local_27b0);
      auVar109._0_4_ = fVar146 * auVar86._0_4_;
      auVar109._4_4_ = fVar146 * auVar86._4_4_;
      auVar109._8_4_ = fVar146 * auVar86._8_4_;
      auVar109._12_4_ = fVar146 * auVar86._12_4_;
      auVar86 = vfmadd231ps_fma(auVar109,auVar158,auVar99);
      auVar92._0_4_ = auVar162._0_4_ * fVar146;
      auVar92._4_4_ = auVar162._4_4_ * fVar146;
      auVar92._8_4_ = auVar162._8_4_ * fVar146;
      auVar92._12_4_ = auVar162._12_4_ * fVar146;
      auVar99 = vfmadd231ps_fma(auVar92,auVar158,auVar100);
      auVar162._0_4_ = fVar146 * auVar15._0_4_;
      auVar162._4_4_ = fVar146 * auVar15._4_4_;
      auVar162._8_4_ = fVar146 * auVar15._8_4_;
      auVar162._12_4_ = fVar146 * auVar15._12_4_;
      auVar162 = vfmadd231ps_fma(auVar162,auVar158,auVar113);
      auVar100._0_4_ = fVar146 * auVar69._0_4_;
      auVar100._4_4_ = fVar146 * auVar69._4_4_;
      auVar100._8_4_ = fVar146 * auVar69._8_4_;
      auVar100._12_4_ = fVar146 * auVar69._12_4_;
      auVar69 = vfmadd231ps_fma(auVar100,auVar158,auVar80);
      auVar80._0_4_ = auVar132._0_4_ * fVar146;
      auVar80._4_4_ = auVar132._4_4_ * fVar146;
      auVar80._8_4_ = auVar132._8_4_ * fVar146;
      auVar80._12_4_ = auVar132._12_4_ * fVar146;
      auVar80 = vfmadd231ps_fma(auVar80,auVar158,auVar87);
      auVar87._0_4_ = fVar146 * auVar17._0_4_;
      auVar87._4_4_ = fVar146 * auVar17._4_4_;
      auVar87._8_4_ = fVar146 * auVar17._8_4_;
      auVar87._12_4_ = fVar146 * auVar17._12_4_;
      auVar87 = vfmadd231ps_fma(auVar87,auVar158,auVar127);
      auVar127._0_4_ = auVar63._0_4_ * fVar146;
      auVar127._4_4_ = auVar63._4_4_ * fVar146;
      auVar127._8_4_ = auVar63._8_4_ * fVar146;
      auVar127._12_4_ = auVar63._12_4_ * fVar146;
      auVar63 = vfmadd231ps_fma(auVar127,auVar158,local_27e0);
      auVar132._0_4_ = auVar16._0_4_ * fVar146;
      auVar132._4_4_ = auVar16._4_4_ * fVar146;
      auVar132._8_4_ = auVar16._8_4_ * fVar146;
      auVar132._12_4_ = auVar16._12_4_ * fVar146;
      auVar100 = vfmadd231ps_fma(auVar132,auVar158,auVar117);
      auVar113._0_4_ = fVar146 * auVar62._0_4_;
      auVar113._4_4_ = fVar146 * auVar62._4_4_;
      auVar113._8_4_ = fVar146 * auVar62._8_4_;
      auVar113._12_4_ = fVar146 * auVar62._12_4_;
      auVar117._0_4_ = auVar68._0_4_ * fVar146;
      auVar117._4_4_ = auVar68._4_4_ * fVar146;
      auVar117._8_4_ = auVar68._8_4_ * fVar146;
      auVar117._12_4_ = auVar68._12_4_ * fVar146;
      lVar40 = uVar47 + 0x40 + lVar49;
      local_23c0 = *(undefined8 *)(lVar40 + 0x10);
      uStack_23b8 = *(undefined8 *)(lVar40 + 0x18);
      auVar62._0_4_ = auVar79._0_4_ * fVar146;
      auVar62._4_4_ = auVar79._4_4_ * fVar146;
      auVar62._8_4_ = auVar79._8_4_ * fVar146;
      auVar62._12_4_ = auVar79._12_4_ * fVar146;
      uStack_23b0 = local_23c0;
      uStack_23a8 = uStack_23b8;
      lVar49 = uVar47 + 0x50 + lVar49;
      local_27a0 = *(undefined8 *)(lVar49 + 0x10);
      uStack_2798 = *(undefined8 *)(lVar49 + 0x18);
      auVar68 = vfmadd231ps_fma(auVar113,auVar158,local_27c0);
      auVar79 = vfmadd231ps_fma(auVar117,auVar158,local_27d0);
      auVar62 = vfmadd231ps_fma(auVar62,auVar158,auVar2);
      uStack_2790 = local_27a0;
      uStack_2788 = uStack_2798;
      auVar73._16_16_ = auVar87;
      auVar73._0_16_ = auVar3;
      auVar89._16_16_ = auVar63;
      auVar89._0_16_ = auVar86;
      auVar93._16_16_ = auVar100;
      auVar93._0_16_ = auVar99;
      auVar128._16_16_ = auVar162;
      auVar128._0_16_ = auVar162;
      auVar101._16_16_ = auVar69;
      auVar101._0_16_ = auVar69;
      auVar81._16_16_ = auVar80;
      auVar81._0_16_ = auVar80;
      auVar163._16_16_ = auVar68;
      auVar163._0_16_ = auVar68;
      auVar118._16_16_ = auVar79;
      auVar118._0_16_ = auVar79;
      uVar148 = *(undefined4 *)(ray + k * 4);
      auVar137._4_4_ = uVar148;
      auVar137._0_4_ = uVar148;
      auVar137._8_4_ = uVar148;
      auVar137._12_4_ = uVar148;
      auVar137._16_4_ = uVar148;
      auVar137._20_4_ = uVar148;
      auVar137._24_4_ = uVar148;
      auVar137._28_4_ = uVar148;
      uVar148 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar149._4_4_ = uVar148;
      auVar149._0_4_ = uVar148;
      auVar149._8_4_ = uVar148;
      auVar149._12_4_ = uVar148;
      auVar149._16_4_ = uVar148;
      auVar149._20_4_ = uVar148;
      auVar149._24_4_ = uVar148;
      auVar149._28_4_ = uVar148;
      auVar64._16_16_ = auVar62;
      auVar64._0_16_ = auVar62;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar159._4_4_ = uVar1;
      auVar159._0_4_ = uVar1;
      auVar159._8_4_ = uVar1;
      auVar159._12_4_ = uVar1;
      auVar159._16_4_ = uVar1;
      auVar159._20_4_ = uVar1;
      auVar159._24_4_ = uVar1;
      auVar159._28_4_ = uVar1;
      local_29c0 = vsubps_avx(auVar73,auVar137);
      local_2960 = vsubps_avx(auVar89,auVar149);
      local_2800 = vsubps_avx(auVar93,auVar159);
      auVar71 = vsubps_avx(auVar128,auVar137);
      auVar88 = vsubps_avx(auVar101,auVar149);
      auVar77 = vsubps_avx(auVar81,auVar159);
      auVar10 = vsubps_avx(auVar163,auVar137);
      auVar11 = vsubps_avx(auVar118,auVar149);
      auVar12 = vsubps_avx(auVar64,auVar159);
      local_2820 = vsubps_avx(auVar10,local_29c0);
      local_2860 = vsubps_avx(auVar11,local_2960);
      local_2840 = vsubps_avx(auVar12,local_2800);
      auVar65._0_4_ = local_29c0._0_4_ + auVar10._0_4_;
      auVar65._4_4_ = local_29c0._4_4_ + auVar10._4_4_;
      auVar65._8_4_ = local_29c0._8_4_ + auVar10._8_4_;
      auVar65._12_4_ = local_29c0._12_4_ + auVar10._12_4_;
      auVar65._16_4_ = local_29c0._16_4_ + auVar10._16_4_;
      auVar65._20_4_ = local_29c0._20_4_ + auVar10._20_4_;
      auVar65._24_4_ = local_29c0._24_4_ + auVar10._24_4_;
      auVar65._28_4_ = local_29c0._28_4_ + auVar10._28_4_;
      auVar82._0_4_ = auVar11._0_4_ + local_2960._0_4_;
      auVar82._4_4_ = auVar11._4_4_ + local_2960._4_4_;
      auVar82._8_4_ = auVar11._8_4_ + local_2960._8_4_;
      auVar82._12_4_ = auVar11._12_4_ + local_2960._12_4_;
      auVar82._16_4_ = auVar11._16_4_ + local_2960._16_4_;
      auVar82._20_4_ = auVar11._20_4_ + local_2960._20_4_;
      auVar82._24_4_ = auVar11._24_4_ + local_2960._24_4_;
      fVar98 = local_2960._28_4_;
      auVar82._28_4_ = auVar11._28_4_ + fVar98;
      fVar157 = local_2800._0_4_;
      auVar94._0_4_ = auVar12._0_4_ + fVar157;
      fVar161 = local_2800._4_4_;
      auVar94._4_4_ = auVar12._4_4_ + fVar161;
      fVar131 = local_2800._8_4_;
      auVar94._8_4_ = auVar12._8_4_ + fVar131;
      fVar136 = local_2800._12_4_;
      auVar94._12_4_ = auVar12._12_4_ + fVar136;
      fVar141 = local_2800._16_4_;
      auVar94._16_4_ = auVar12._16_4_ + fVar141;
      fVar134 = local_2800._20_4_;
      auVar94._20_4_ = auVar12._20_4_ + fVar134;
      fVar135 = local_2800._24_4_;
      auVar94._24_4_ = auVar12._24_4_ + fVar135;
      auVar94._28_4_ = auVar12._28_4_ + local_2800._28_4_;
      auVar19._4_4_ = local_2840._4_4_ * auVar82._4_4_;
      auVar19._0_4_ = local_2840._0_4_ * auVar82._0_4_;
      auVar19._8_4_ = local_2840._8_4_ * auVar82._8_4_;
      auVar19._12_4_ = local_2840._12_4_ * auVar82._12_4_;
      auVar19._16_4_ = local_2840._16_4_ * auVar82._16_4_;
      auVar19._20_4_ = local_2840._20_4_ * auVar82._20_4_;
      auVar19._24_4_ = local_2840._24_4_ * auVar82._24_4_;
      auVar19._28_4_ = uVar148;
      auVar79 = vfmsub231ps_fma(auVar19,local_2860,auVar94);
      auVar20._4_4_ = local_2820._4_4_ * auVar94._4_4_;
      auVar20._0_4_ = local_2820._0_4_ * auVar94._0_4_;
      auVar20._8_4_ = local_2820._8_4_ * auVar94._8_4_;
      auVar20._12_4_ = local_2820._12_4_ * auVar94._12_4_;
      auVar20._16_4_ = local_2820._16_4_ * auVar94._16_4_;
      auVar20._20_4_ = local_2820._20_4_ * auVar94._20_4_;
      auVar20._24_4_ = local_2820._24_4_ * auVar94._24_4_;
      auVar20._28_4_ = auVar94._28_4_;
      auVar68 = vfmsub231ps_fma(auVar20,local_2840,auVar65);
      auVar21._4_4_ = local_2860._4_4_ * auVar65._4_4_;
      auVar21._0_4_ = local_2860._0_4_ * auVar65._0_4_;
      auVar21._8_4_ = local_2860._8_4_ * auVar65._8_4_;
      auVar21._12_4_ = local_2860._12_4_ * auVar65._12_4_;
      auVar21._16_4_ = local_2860._16_4_ * auVar65._16_4_;
      auVar21._20_4_ = local_2860._20_4_ * auVar65._20_4_;
      auVar21._24_4_ = local_2860._24_4_ * auVar65._24_4_;
      auVar21._28_4_ = auVar65._28_4_;
      auVar86 = vfmsub231ps_fma(auVar21,local_2820,auVar82);
      uVar148 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar160._4_4_ = uVar148;
      auVar160._0_4_ = uVar148;
      auVar160._8_4_ = uVar148;
      auVar160._12_4_ = uVar148;
      auVar160._16_4_ = uVar148;
      auVar160._20_4_ = uVar148;
      auVar160._24_4_ = uVar148;
      auVar160._28_4_ = uVar148;
      fVar146 = *(float *)(ray + k * 4 + 0x60);
      auVar22._4_4_ = fVar146 * auVar86._4_4_;
      auVar22._0_4_ = fVar146 * auVar86._0_4_;
      auVar22._8_4_ = fVar146 * auVar86._8_4_;
      auVar22._12_4_ = fVar146 * auVar86._12_4_;
      auVar22._16_4_ = fVar146 * 0.0;
      auVar22._20_4_ = fVar146 * 0.0;
      auVar22._24_4_ = fVar146 * 0.0;
      auVar22._28_4_ = local_2840._28_4_;
      auVar68 = vfmadd231ps_fma(auVar22,auVar160,ZEXT1632(auVar68));
      uVar148 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar114._4_4_ = uVar148;
      auVar114._0_4_ = uVar148;
      auVar114._8_4_ = uVar148;
      auVar114._12_4_ = uVar148;
      auVar114._16_4_ = uVar148;
      auVar114._20_4_ = uVar148;
      auVar114._24_4_ = uVar148;
      auVar114._28_4_ = uVar148;
      auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar114,ZEXT1632(auVar79));
      local_2880 = vsubps_avx(local_2960,auVar88);
      local_28a0 = vsubps_avx(local_2800,auVar77);
      auVar83._0_4_ = auVar88._0_4_ + local_2960._0_4_;
      auVar83._4_4_ = auVar88._4_4_ + local_2960._4_4_;
      auVar83._8_4_ = auVar88._8_4_ + local_2960._8_4_;
      auVar83._12_4_ = auVar88._12_4_ + local_2960._12_4_;
      auVar83._16_4_ = auVar88._16_4_ + local_2960._16_4_;
      auVar83._20_4_ = auVar88._20_4_ + local_2960._20_4_;
      auVar83._24_4_ = auVar88._24_4_ + local_2960._24_4_;
      auVar83._28_4_ = auVar88._28_4_ + fVar98;
      auVar95._0_4_ = fVar157 + auVar77._0_4_;
      auVar95._4_4_ = fVar161 + auVar77._4_4_;
      auVar95._8_4_ = fVar131 + auVar77._8_4_;
      auVar95._12_4_ = fVar136 + auVar77._12_4_;
      auVar95._16_4_ = fVar141 + auVar77._16_4_;
      auVar95._20_4_ = fVar134 + auVar77._20_4_;
      auVar95._24_4_ = fVar135 + auVar77._24_4_;
      auVar95._28_4_ = local_2800._28_4_ + auVar77._28_4_;
      fVar147 = local_28a0._0_4_;
      fVar151 = local_28a0._4_4_;
      auVar23._4_4_ = fVar151 * auVar83._4_4_;
      auVar23._0_4_ = fVar147 * auVar83._0_4_;
      fVar152 = local_28a0._8_4_;
      auVar23._8_4_ = fVar152 * auVar83._8_4_;
      fVar153 = local_28a0._12_4_;
      auVar23._12_4_ = fVar153 * auVar83._12_4_;
      fVar154 = local_28a0._16_4_;
      auVar23._16_4_ = fVar154 * auVar83._16_4_;
      fVar155 = local_28a0._20_4_;
      auVar23._20_4_ = fVar155 * auVar83._20_4_;
      fVar156 = local_28a0._24_4_;
      auVar23._24_4_ = fVar156 * auVar83._24_4_;
      auVar23._28_4_ = fVar98;
      auVar86 = vfmsub231ps_fma(auVar23,local_2880,auVar95);
      auVar13 = vsubps_avx(local_29c0,auVar71);
      fVar98 = auVar13._0_4_;
      fVar104 = auVar13._4_4_;
      auVar24._4_4_ = auVar95._4_4_ * fVar104;
      auVar24._0_4_ = auVar95._0_4_ * fVar98;
      fVar106 = auVar13._8_4_;
      auVar24._8_4_ = auVar95._8_4_ * fVar106;
      fVar108 = auVar13._12_4_;
      auVar24._12_4_ = auVar95._12_4_ * fVar108;
      fVar139 = auVar13._16_4_;
      auVar24._16_4_ = auVar95._16_4_ * fVar139;
      fVar142 = auVar13._20_4_;
      auVar24._20_4_ = auVar95._20_4_ * fVar142;
      fVar144 = auVar13._24_4_;
      auVar24._24_4_ = auVar95._24_4_ * fVar144;
      auVar24._28_4_ = auVar95._28_4_;
      auVar119._0_4_ = local_29c0._0_4_ + auVar71._0_4_;
      auVar119._4_4_ = local_29c0._4_4_ + auVar71._4_4_;
      auVar119._8_4_ = local_29c0._8_4_ + auVar71._8_4_;
      auVar119._12_4_ = local_29c0._12_4_ + auVar71._12_4_;
      auVar119._16_4_ = local_29c0._16_4_ + auVar71._16_4_;
      auVar119._20_4_ = local_29c0._20_4_ + auVar71._20_4_;
      auVar119._24_4_ = local_29c0._24_4_ + auVar71._24_4_;
      auVar119._28_4_ = local_29c0._28_4_ + auVar71._28_4_;
      auVar79 = vfmsub231ps_fma(auVar24,local_28a0,auVar119);
      fVar103 = local_2880._0_4_;
      fVar105 = local_2880._4_4_;
      auVar25._4_4_ = auVar119._4_4_ * fVar105;
      auVar25._0_4_ = auVar119._0_4_ * fVar103;
      fVar107 = local_2880._8_4_;
      auVar25._8_4_ = auVar119._8_4_ * fVar107;
      fVar138 = local_2880._12_4_;
      auVar25._12_4_ = auVar119._12_4_ * fVar138;
      fVar140 = local_2880._16_4_;
      auVar25._16_4_ = auVar119._16_4_ * fVar140;
      fVar143 = local_2880._20_4_;
      auVar25._20_4_ = auVar119._20_4_ * fVar143;
      fVar145 = local_2880._24_4_;
      auVar25._24_4_ = auVar119._24_4_ * fVar145;
      auVar25._28_4_ = auVar119._28_4_;
      auVar69 = vfmsub231ps_fma(auVar25,auVar13,auVar83);
      auVar26._4_4_ = auVar69._4_4_ * fVar146;
      auVar26._0_4_ = auVar69._0_4_ * fVar146;
      auVar26._8_4_ = auVar69._8_4_ * fVar146;
      auVar26._12_4_ = auVar69._12_4_ * fVar146;
      auVar26._16_4_ = fVar146 * 0.0;
      auVar26._20_4_ = fVar146 * 0.0;
      auVar26._24_4_ = fVar146 * 0.0;
      auVar26._28_4_ = auVar83._28_4_;
      auVar79 = vfmadd231ps_fma(auVar26,auVar160,ZEXT1632(auVar79));
      auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar114,ZEXT1632(auVar86));
      auVar14 = vsubps_avx(auVar71,auVar10);
      auVar90._0_4_ = auVar71._0_4_ + auVar10._0_4_;
      auVar90._4_4_ = auVar71._4_4_ + auVar10._4_4_;
      auVar90._8_4_ = auVar71._8_4_ + auVar10._8_4_;
      auVar90._12_4_ = auVar71._12_4_ + auVar10._12_4_;
      auVar90._16_4_ = auVar71._16_4_ + auVar10._16_4_;
      auVar90._20_4_ = auVar71._20_4_ + auVar10._20_4_;
      auVar90._24_4_ = auVar71._24_4_ + auVar10._24_4_;
      auVar90._28_4_ = auVar71._28_4_ + auVar10._28_4_;
      auVar10 = vsubps_avx(auVar88,auVar11);
      auVar102._0_4_ = auVar88._0_4_ + auVar11._0_4_;
      auVar102._4_4_ = auVar88._4_4_ + auVar11._4_4_;
      auVar102._8_4_ = auVar88._8_4_ + auVar11._8_4_;
      auVar102._12_4_ = auVar88._12_4_ + auVar11._12_4_;
      auVar102._16_4_ = auVar88._16_4_ + auVar11._16_4_;
      auVar102._20_4_ = auVar88._20_4_ + auVar11._20_4_;
      auVar102._24_4_ = auVar88._24_4_ + auVar11._24_4_;
      auVar102._28_4_ = auVar88._28_4_ + auVar11._28_4_;
      auVar11 = vsubps_avx(auVar77,auVar12);
      auVar74._0_4_ = auVar77._0_4_ + auVar12._0_4_;
      auVar74._4_4_ = auVar77._4_4_ + auVar12._4_4_;
      auVar74._8_4_ = auVar77._8_4_ + auVar12._8_4_;
      auVar74._12_4_ = auVar77._12_4_ + auVar12._12_4_;
      auVar74._16_4_ = auVar77._16_4_ + auVar12._16_4_;
      auVar74._20_4_ = auVar77._20_4_ + auVar12._20_4_;
      auVar74._24_4_ = auVar77._24_4_ + auVar12._24_4_;
      auVar74._28_4_ = auVar77._28_4_ + auVar12._28_4_;
      auVar110._0_4_ = auVar11._0_4_ * auVar102._0_4_;
      auVar110._4_4_ = auVar11._4_4_ * auVar102._4_4_;
      auVar110._8_4_ = auVar11._8_4_ * auVar102._8_4_;
      auVar110._12_4_ = auVar11._12_4_ * auVar102._12_4_;
      auVar110._16_4_ = auVar11._16_4_ * auVar102._16_4_;
      auVar110._20_4_ = auVar11._20_4_ * auVar102._20_4_;
      auVar110._24_4_ = auVar11._24_4_ * auVar102._24_4_;
      auVar110._28_4_ = 0;
      auVar69 = vfmsub231ps_fma(auVar110,auVar10,auVar74);
      auVar27._4_4_ = auVar74._4_4_ * auVar14._4_4_;
      auVar27._0_4_ = auVar74._0_4_ * auVar14._0_4_;
      auVar27._8_4_ = auVar74._8_4_ * auVar14._8_4_;
      auVar27._12_4_ = auVar74._12_4_ * auVar14._12_4_;
      auVar27._16_4_ = auVar74._16_4_ * auVar14._16_4_;
      auVar27._20_4_ = auVar74._20_4_ * auVar14._20_4_;
      auVar27._24_4_ = auVar74._24_4_ * auVar14._24_4_;
      auVar27._28_4_ = auVar74._28_4_;
      auVar86 = vfmsub231ps_fma(auVar27,auVar11,auVar90);
      auVar28._4_4_ = auVar10._4_4_ * auVar90._4_4_;
      auVar28._0_4_ = auVar10._0_4_ * auVar90._0_4_;
      auVar28._8_4_ = auVar10._8_4_ * auVar90._8_4_;
      auVar28._12_4_ = auVar10._12_4_ * auVar90._12_4_;
      auVar28._16_4_ = auVar10._16_4_ * auVar90._16_4_;
      auVar28._20_4_ = auVar10._20_4_ * auVar90._20_4_;
      auVar28._24_4_ = auVar10._24_4_ * auVar90._24_4_;
      auVar28._28_4_ = auVar90._28_4_;
      auVar99 = vfmsub231ps_fma(auVar28,auVar14,auVar102);
      auVar91._0_4_ = fVar146 * auVar99._0_4_;
      auVar91._4_4_ = fVar146 * auVar99._4_4_;
      auVar91._8_4_ = fVar146 * auVar99._8_4_;
      auVar91._12_4_ = fVar146 * auVar99._12_4_;
      auVar91._16_4_ = fVar146 * 0.0;
      auVar91._20_4_ = fVar146 * 0.0;
      auVar91._24_4_ = fVar146 * 0.0;
      auVar91._28_4_ = 0;
      auVar86 = vfmadd231ps_fma(auVar91,auVar160,ZEXT1632(auVar86));
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar114,ZEXT1632(auVar69));
      local_26a0 = ZEXT1632(CONCAT412(auVar86._12_4_ + auVar68._12_4_ + auVar79._12_4_,
                                      CONCAT48(auVar86._8_4_ + auVar68._8_4_ + auVar79._8_4_,
                                               CONCAT44(auVar86._4_4_ +
                                                        auVar68._4_4_ + auVar79._4_4_,
                                                        auVar86._0_4_ +
                                                        auVar68._0_4_ + auVar79._0_4_))));
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar75._16_4_ = 0x7fffffff;
      auVar75._20_4_ = 0x7fffffff;
      auVar75._24_4_ = 0x7fffffff;
      auVar75._28_4_ = 0x7fffffff;
      local_28e0 = ZEXT1632(auVar68);
      auVar71 = vminps_avx(local_28e0,ZEXT1632(auVar79));
      auVar71 = vminps_avx(auVar71,ZEXT1632(auVar86));
      local_2900 = vandps_avx(local_26a0,auVar75);
      fVar116 = local_2900._0_4_ * 1.1920929e-07;
      fVar121 = local_2900._4_4_ * 1.1920929e-07;
      auVar29._4_4_ = fVar121;
      auVar29._0_4_ = fVar116;
      fVar122 = local_2900._8_4_ * 1.1920929e-07;
      auVar29._8_4_ = fVar122;
      fVar123 = local_2900._12_4_ * 1.1920929e-07;
      auVar29._12_4_ = fVar123;
      fVar124 = local_2900._16_4_ * 1.1920929e-07;
      auVar29._16_4_ = fVar124;
      fVar125 = local_2900._20_4_ * 1.1920929e-07;
      auVar29._20_4_ = fVar125;
      fVar126 = local_2900._24_4_ * 1.1920929e-07;
      auVar29._24_4_ = fVar126;
      auVar29._28_4_ = 0x34000000;
      auVar111._0_8_ = CONCAT44(fVar121,fVar116) ^ 0x8000000080000000;
      auVar111._8_4_ = -fVar122;
      auVar111._12_4_ = -fVar123;
      auVar111._16_4_ = -fVar124;
      auVar111._20_4_ = -fVar125;
      auVar111._24_4_ = -fVar126;
      auVar111._28_4_ = 0xb4000000;
      auVar71 = vcmpps_avx(auVar71,auVar111,5);
      auVar77 = vmaxps_avx(local_28e0,ZEXT1632(auVar79));
      auVar88 = vmaxps_avx(auVar77,ZEXT1632(auVar86));
      auVar88 = vcmpps_avx(auVar88,auVar29,2);
      auVar88 = vorps_avx(auVar71,auVar88);
      if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar88 >> 0x7f,0) != '\0') ||
            (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar88 >> 0xbf,0) != '\0') ||
          (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar88[0x1f] < '\0') {
        auVar30._4_4_ = fVar105 * local_2840._4_4_;
        auVar30._0_4_ = fVar103 * local_2840._0_4_;
        auVar30._8_4_ = fVar107 * local_2840._8_4_;
        auVar30._12_4_ = fVar138 * local_2840._12_4_;
        auVar30._16_4_ = fVar140 * local_2840._16_4_;
        auVar30._20_4_ = fVar143 * local_2840._20_4_;
        auVar30._24_4_ = fVar145 * local_2840._24_4_;
        auVar30._28_4_ = auVar71._28_4_;
        local_28c0 = fVar98 * local_2860._0_4_;
        fStack_28bc = fVar104 * local_2860._4_4_;
        fStack_28b8 = fVar106 * local_2860._8_4_;
        fStack_28b4 = fVar108 * local_2860._12_4_;
        fStack_28b0 = fVar139 * local_2860._16_4_;
        fStack_28ac = fVar142 * local_2860._20_4_;
        uStack_28a4 = auVar77._28_4_;
        fStack_28a8 = fVar144 * local_2860._24_4_;
        auVar86 = vfmsub213ps_fma(local_2860,local_28a0,auVar30);
        auVar31._4_4_ = auVar10._4_4_ * fVar151;
        auVar31._0_4_ = auVar10._0_4_ * fVar147;
        auVar31._8_4_ = auVar10._8_4_ * fVar152;
        auVar31._12_4_ = auVar10._12_4_ * fVar153;
        auVar31._16_4_ = auVar10._16_4_ * fVar154;
        auVar31._20_4_ = auVar10._20_4_ * fVar155;
        auVar31._24_4_ = auVar10._24_4_ * fVar156;
        auVar31._28_4_ = uStack_28a4;
        auVar32._4_4_ = auVar11._4_4_ * fVar104;
        auVar32._0_4_ = auVar11._0_4_ * fVar98;
        auVar32._8_4_ = auVar11._8_4_ * fVar106;
        auVar32._12_4_ = auVar11._12_4_ * fVar108;
        auVar32._16_4_ = auVar11._16_4_ * fVar139;
        auVar32._20_4_ = auVar11._20_4_ * fVar142;
        auVar32._24_4_ = auVar11._24_4_ * fVar144;
        auVar32._28_4_ = local_2900._28_4_;
        auVar69 = vfmsub213ps_fma(auVar11,local_2880,auVar31);
        auVar71 = vandps_avx(auVar30,auVar75);
        auVar77 = vandps_avx(auVar31,auVar75);
        auVar71 = vcmpps_avx(auVar71,auVar77,1);
        local_2680 = vblendvps_avx(ZEXT1632(auVar69),ZEXT1632(auVar86),auVar71);
        auVar33._4_4_ = fVar105 * auVar14._4_4_;
        auVar33._0_4_ = fVar103 * auVar14._0_4_;
        auVar33._8_4_ = fVar107 * auVar14._8_4_;
        auVar33._12_4_ = fVar138 * auVar14._12_4_;
        auVar33._16_4_ = fVar140 * auVar14._16_4_;
        auVar33._20_4_ = fVar143 * auVar14._20_4_;
        auVar33._24_4_ = fVar145 * auVar14._24_4_;
        auVar33._28_4_ = auVar71._28_4_;
        auVar86 = vfmsub213ps_fma(auVar14,local_28a0,auVar32);
        auVar34._4_4_ = local_2820._4_4_ * fVar151;
        auVar34._0_4_ = local_2820._0_4_ * fVar147;
        auVar34._8_4_ = local_2820._8_4_ * fVar152;
        auVar34._12_4_ = local_2820._12_4_ * fVar153;
        auVar34._16_4_ = local_2820._16_4_ * fVar154;
        auVar34._20_4_ = local_2820._20_4_ * fVar155;
        auVar34._24_4_ = local_2820._24_4_ * fVar156;
        auVar34._28_4_ = auVar77._28_4_;
        auVar69 = vfmsub213ps_fma(local_2840,auVar13,auVar34);
        auVar71 = vandps_avx(auVar34,auVar75);
        auVar77 = vandps_avx(auVar32,auVar75);
        auVar71 = vcmpps_avx(auVar71,auVar77,1);
        local_2660 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar69),auVar71);
        auVar37._4_4_ = fStack_28bc;
        auVar37._0_4_ = local_28c0;
        auVar37._8_4_ = fStack_28b8;
        auVar37._12_4_ = fStack_28b4;
        auVar37._16_4_ = fStack_28b0;
        auVar37._20_4_ = fStack_28ac;
        auVar37._24_4_ = fStack_28a8;
        auVar37._28_4_ = uStack_28a4;
        auVar86 = vfmsub213ps_fma(local_2820,local_2880,auVar37);
        auVar69 = vfmsub213ps_fma(auVar10,auVar13,auVar33);
        auVar71 = vandps_avx(auVar37,auVar75);
        auVar77 = vandps_avx(auVar33,auVar75);
        auVar77 = vcmpps_avx(auVar71,auVar77,1);
        local_2640 = vblendvps_avx(ZEXT1632(auVar69),ZEXT1632(auVar86),auVar77);
        auVar86 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
        fVar98 = local_2640._0_4_;
        auVar76._0_4_ = fVar98 * fVar146;
        fVar103 = local_2640._4_4_;
        auVar76._4_4_ = fVar103 * fVar146;
        fVar104 = local_2640._8_4_;
        auVar76._8_4_ = fVar104 * fVar146;
        fVar105 = local_2640._12_4_;
        auVar76._12_4_ = fVar105 * fVar146;
        fVar106 = local_2640._16_4_;
        auVar76._16_4_ = fVar106 * fVar146;
        fVar107 = local_2640._20_4_;
        auVar76._20_4_ = fVar107 * fVar146;
        fVar108 = local_2640._24_4_;
        auVar76._24_4_ = fVar108 * fVar146;
        auVar76._28_4_ = 0;
        auVar69 = vfmadd213ps_fma(auVar160,local_2660,auVar76);
        auVar69 = vfmadd213ps_fma(auVar114,local_2680,ZEXT1632(auVar69));
        auVar77 = ZEXT1632(CONCAT412(auVar69._12_4_ + auVar69._12_4_,
                                     CONCAT48(auVar69._8_4_ + auVar69._8_4_,
                                              CONCAT44(auVar69._4_4_ + auVar69._4_4_,
                                                       auVar69._0_4_ + auVar69._0_4_))));
        auVar35._4_4_ = fVar103 * fVar161;
        auVar35._0_4_ = fVar98 * fVar157;
        auVar35._8_4_ = fVar104 * fVar131;
        auVar35._12_4_ = fVar105 * fVar136;
        auVar35._16_4_ = fVar106 * fVar141;
        auVar35._20_4_ = fVar107 * fVar134;
        auVar35._24_4_ = fVar108 * fVar135;
        auVar35._28_4_ = auVar71._28_4_;
        auVar69 = vfmadd213ps_fma(local_2960,local_2660,auVar35);
        auVar99 = vfmadd213ps_fma(local_29c0,local_2680,ZEXT1632(auVar69));
        auVar71 = vrcpps_avx(auVar77);
        auVar133._8_4_ = 0x3f800000;
        auVar133._0_8_ = 0x3f8000003f800000;
        auVar133._12_4_ = 0x3f800000;
        auVar133._16_4_ = 0x3f800000;
        auVar133._20_4_ = 0x3f800000;
        auVar133._24_4_ = 0x3f800000;
        auVar133._28_4_ = 0x3f800000;
        auVar69 = vfnmadd213ps_fma(auVar71,auVar77,auVar133);
        auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar71,auVar71);
        local_25c0._28_4_ = 0x3f800000;
        local_25c0._0_28_ =
             ZEXT1628(CONCAT412(auVar69._12_4_ * (auVar99._12_4_ + auVar99._12_4_),
                                CONCAT48(auVar69._8_4_ * (auVar99._8_4_ + auVar99._8_4_),
                                         CONCAT44(auVar69._4_4_ * (auVar99._4_4_ + auVar99._4_4_),
                                                  auVar69._0_4_ * (auVar99._0_4_ + auVar99._0_4_))))
                     );
        auVar67 = ZEXT3264(local_25c0);
        uVar148 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar96._4_4_ = uVar148;
        auVar96._0_4_ = uVar148;
        auVar96._8_4_ = uVar148;
        auVar96._12_4_ = uVar148;
        auVar96._16_4_ = uVar148;
        auVar96._20_4_ = uVar148;
        auVar96._24_4_ = uVar148;
        auVar96._28_4_ = uVar148;
        uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar150._4_4_ = uVar148;
        auVar150._0_4_ = uVar148;
        auVar150._8_4_ = uVar148;
        auVar150._12_4_ = uVar148;
        auVar150._16_4_ = uVar148;
        auVar150._20_4_ = uVar148;
        auVar150._24_4_ = uVar148;
        auVar150._28_4_ = uVar148;
        auVar112 = ZEXT3264(auVar150);
        auVar71 = vcmpps_avx(auVar96,local_25c0,2);
        auVar88 = vcmpps_avx(local_25c0,auVar150,2);
        auVar71 = vandps_avx(auVar88,auVar71);
        auVar69 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
        auVar86 = vpand_avx(auVar69,auVar86);
        auVar71 = vpmovsxwd_avx2(auVar86);
        if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar71 >> 0x7f,0) != '\0') ||
              (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar71 >> 0xbf,0) != '\0') ||
            (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar71[0x1f] < '\0') {
          auVar71 = vcmpps_avx(auVar77,_DAT_01f7b000,4);
          auVar69 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
          auVar86 = vpand_avx(auVar86,auVar69);
          local_2940 = vpmovsxwd_avx2(auVar86);
          if ((((((((local_2940 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_2940 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_2940 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_2940 >> 0x7f,0) != '\0') ||
                (local_2940 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_2940 >> 0xbf,0) != '\0') ||
              (local_2940 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_2940[0x1f] < '\0') {
            local_26e0 = ZEXT1632(auVar68);
            local_26c0 = ZEXT1632(auVar79);
            local_2620 = local_2940;
            local_2540 = local_2500;
            auVar71 = vrcpps_avx(local_26a0);
            auVar129._8_4_ = 0x3f800000;
            auVar129._0_8_ = 0x3f8000003f800000;
            auVar129._12_4_ = 0x3f800000;
            auVar129._16_4_ = 0x3f800000;
            auVar129._20_4_ = 0x3f800000;
            auVar129._24_4_ = 0x3f800000;
            auVar129._28_4_ = 0x3f800000;
            auVar69 = vfnmadd213ps_fma(local_26a0,auVar71,auVar129);
            auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar71,auVar71);
            auVar97._8_4_ = 0x219392ef;
            auVar97._0_8_ = 0x219392ef219392ef;
            auVar97._12_4_ = 0x219392ef;
            auVar97._16_4_ = 0x219392ef;
            auVar97._20_4_ = 0x219392ef;
            auVar97._24_4_ = 0x219392ef;
            auVar97._28_4_ = 0x219392ef;
            auVar71 = vcmpps_avx(local_2900,auVar97,5);
            auVar71 = vandps_avx(auVar71,ZEXT1632(auVar69));
            auVar36._4_4_ = auVar68._4_4_ * auVar71._4_4_;
            auVar36._0_4_ = auVar68._0_4_ * auVar71._0_4_;
            auVar36._8_4_ = auVar68._8_4_ * auVar71._8_4_;
            auVar36._12_4_ = auVar68._12_4_ * auVar71._12_4_;
            auVar36._16_4_ = auVar71._16_4_ * 0.0;
            auVar36._20_4_ = auVar71._20_4_ * 0.0;
            auVar36._24_4_ = auVar71._24_4_ * 0.0;
            auVar36._28_4_ = 0;
            auVar88 = vminps_avx(auVar36,auVar129);
            auVar84._0_4_ = auVar79._0_4_ * auVar71._0_4_;
            auVar84._4_4_ = auVar79._4_4_ * auVar71._4_4_;
            auVar84._8_4_ = auVar79._8_4_ * auVar71._8_4_;
            auVar84._12_4_ = auVar79._12_4_ * auVar71._12_4_;
            auVar84._16_4_ = auVar71._16_4_ * 0.0;
            auVar84._20_4_ = auVar71._20_4_ * 0.0;
            auVar84._24_4_ = auVar71._24_4_ * 0.0;
            auVar84._28_4_ = 0;
            auVar71 = vminps_avx(auVar84,auVar129);
            auVar77 = vsubps_avx(auVar129,auVar88);
            auVar10 = vsubps_avx(auVar129,auVar71);
            local_25e0 = vblendvps_avx(auVar71,auVar77,local_2500);
            local_2600 = vblendvps_avx(auVar88,auVar10,local_2500);
            local_25a0[0] = local_2680._0_4_ * (float)local_2520._0_4_;
            local_25a0[1] = local_2680._4_4_ * (float)local_2520._4_4_;
            local_25a0[2] = local_2680._8_4_ * fStack_2518;
            local_25a0[3] = local_2680._12_4_ * fStack_2514;
            fStack_2590 = local_2680._16_4_ * fStack_2510;
            fStack_258c = local_2680._20_4_ * fStack_250c;
            fStack_2588 = local_2680._24_4_ * fStack_2508;
            uStack_2584 = local_2600._28_4_;
            local_2580[0] = (float)local_2520._0_4_ * local_2660._0_4_;
            local_2580[1] = (float)local_2520._4_4_ * local_2660._4_4_;
            local_2580[2] = fStack_2518 * local_2660._8_4_;
            local_2580[3] = fStack_2514 * local_2660._12_4_;
            fStack_2570 = fStack_2510 * local_2660._16_4_;
            fStack_256c = fStack_250c * local_2660._20_4_;
            fStack_2568 = fStack_2508 * local_2660._24_4_;
            uStack_2564 = local_25e0._28_4_;
            local_2560[0] = (float)local_2520._0_4_ * fVar98;
            local_2560[1] = (float)local_2520._4_4_ * fVar103;
            local_2560[2] = fStack_2518 * fVar104;
            local_2560[3] = fStack_2514 * fVar105;
            fStack_2550 = fStack_2510 * fVar106;
            fStack_254c = fStack_250c * fVar107;
            fStack_2548 = fStack_2508 * fVar108;
            uStack_2544 = uStack_2504;
            auVar71 = vpmovsxwd_avx2(auVar86);
            auVar85._8_4_ = 0x7f800000;
            auVar85._0_8_ = 0x7f8000007f800000;
            auVar85._12_4_ = 0x7f800000;
            auVar85._16_4_ = 0x7f800000;
            auVar85._20_4_ = 0x7f800000;
            auVar85._24_4_ = 0x7f800000;
            auVar85._28_4_ = 0x7f800000;
            auVar71 = vblendvps_avx(auVar85,local_25c0,auVar71);
            auVar88 = vshufps_avx(auVar71,auVar71,0xb1);
            auVar88 = vminps_avx(auVar71,auVar88);
            auVar77 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar77);
            auVar77 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar77);
            auVar71 = vcmpps_avx(auVar71,auVar88,0);
            auVar68 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
            auVar68 = vpand_avx(auVar68,auVar86);
            auVar71 = vpmovsxwd_avx2(auVar68);
            if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar71 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar71 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar71 >> 0x7f,0) == '\0') &&
                  (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar71 >> 0xbf,0) == '\0') &&
                (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar71[0x1f]) {
              auVar71 = local_2940;
            }
            auVar115 = ZEXT3264(auVar71);
            auVar68 = vpcmpeqd_avx(auVar10._0_16_,auVar10._0_16_);
            auVar120 = ZEXT1664(auVar68);
LAB_01682636:
            uVar38 = vmovmskps_avx(auVar115._0_32_);
            uVar41 = 0;
            for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
              uVar41 = uVar41 + 1;
            }
            uVar58 = CONCAT44(0,uVar41);
            local_2710 = *(uint *)((long)&local_23c0 + uVar58 * 4);
            pGVar59 = (pSVar5->geometries).items[local_2710].ptr;
            if ((pGVar59->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_2940 + uVar58 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar59->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar58 = (ulong)(uVar41 << 2);
                uVar148 = *(undefined4 *)(local_2600 + uVar58);
                uVar1 = *(undefined4 *)(local_25e0 + uVar58);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar58);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_25a0 + uVar58);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_2580 + uVar58);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_2560 + uVar58);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar148;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_27a0 + uVar58);
                *(uint *)(ray + k * 4 + 0x120) = local_2710;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_01682a8b;
              }
              uVar39 = (ulong)(uVar41 * 4);
              uVar148 = *(undefined4 *)(local_2600 + uVar39);
              local_2740._4_4_ = uVar148;
              local_2740._0_4_ = uVar148;
              local_2740._8_4_ = uVar148;
              local_2740._12_4_ = uVar148;
              local_2730 = *(undefined4 *)(local_25e0 + uVar39);
              local_2720 = *(undefined4 *)((long)&local_27a0 + uVar39);
              uVar148 = *(undefined4 *)((long)local_25a0 + uVar39);
              uVar1 = *(undefined4 *)((long)local_2580 + uVar39);
              local_2760._4_4_ = uVar1;
              local_2760._0_4_ = uVar1;
              local_2760._8_4_ = uVar1;
              local_2760._12_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)local_2560 + uVar39);
              local_2750._4_4_ = uVar1;
              local_2750._0_4_ = uVar1;
              local_2750._8_4_ = uVar1;
              local_2750._12_4_ = uVar1;
              local_2770[0] = (RTCHitN)(char)uVar148;
              local_2770[1] = (RTCHitN)(char)((uint)uVar148 >> 8);
              local_2770[2] = (RTCHitN)(char)((uint)uVar148 >> 0x10);
              local_2770[3] = (RTCHitN)(char)((uint)uVar148 >> 0x18);
              local_2770[4] = (RTCHitN)(char)uVar148;
              local_2770[5] = (RTCHitN)(char)((uint)uVar148 >> 8);
              local_2770[6] = (RTCHitN)(char)((uint)uVar148 >> 0x10);
              local_2770[7] = (RTCHitN)(char)((uint)uVar148 >> 0x18);
              local_2770[8] = (RTCHitN)(char)uVar148;
              local_2770[9] = (RTCHitN)(char)((uint)uVar148 >> 8);
              local_2770[10] = (RTCHitN)(char)((uint)uVar148 >> 0x10);
              local_2770[0xb] = (RTCHitN)(char)((uint)uVar148 >> 0x18);
              local_2770[0xc] = (RTCHitN)(char)uVar148;
              local_2770[0xd] = (RTCHitN)(char)((uint)uVar148 >> 8);
              local_2770[0xe] = (RTCHitN)(char)((uint)uVar148 >> 0x10);
              local_2770[0xf] = (RTCHitN)(char)((uint)uVar148 >> 0x18);
              uStack_272c = local_2730;
              uStack_2728 = local_2730;
              uStack_2724 = local_2730;
              uStack_271c = local_2720;
              uStack_2718 = local_2720;
              uStack_2714 = local_2720;
              uStack_270c = local_2710;
              uStack_2708 = local_2710;
              uStack_2704 = local_2710;
              vpcmpeqd_avx2(ZEXT1632(local_2740),ZEXT1632(local_2740));
              uStack_26fc = context->user->instID[0];
              local_2700 = uStack_26fc;
              uStack_26f8 = uStack_26fc;
              uStack_26f4 = uStack_26fc;
              uStack_26f0 = context->user->instPrimID[0];
              uStack_26ec = uStack_26f0;
              uStack_26e8 = uStack_26f0;
              uStack_26e4 = uStack_26f0;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar39);
              local_2a20 = *local_2a10;
              local_2990.valid = (int *)local_2a20;
              local_2990.geometryUserPtr = pGVar59->userPtr;
              local_2990.context = context->user;
              local_2990.hit = local_2770;
              local_2990.N = 4;
              auVar71 = auVar67._0_32_;
              auVar88 = auVar112._0_32_;
              local_29c0._0_8_ = uVar58;
              local_2990.ray = (RTCRayN *)ray;
              if (pGVar59->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                local_2960._0_8_ = pGVar59;
                auVar68 = auVar120._0_16_;
                (*pGVar59->intersectionFilterN)(&local_2990);
                auVar112 = ZEXT3264(auVar88);
                auVar67 = ZEXT3264(auVar71);
                auVar68 = vpcmpeqd_avx(auVar68,auVar68);
                auVar120 = ZEXT1664(auVar68);
                uVar58 = local_29c0._0_8_;
                pGVar59 = (Geometry *)local_2960._0_8_;
              }
              auVar68 = auVar120._0_16_;
              if (local_2a20 == (undefined1  [16])0x0) {
                auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar79 = auVar79 ^ auVar68;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar59->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var9)(&local_2990);
                  auVar112 = ZEXT3264(auVar88);
                  auVar67 = ZEXT3264(auVar71);
                  auVar68 = vpcmpeqd_avx(auVar68,auVar68);
                  auVar120 = ZEXT1664(auVar68);
                  uVar58 = local_29c0._0_8_;
                }
                auVar68 = vpcmpeqd_avx(local_2a20,_DAT_01f45a50);
                auVar79 = auVar68 ^ auVar120._0_16_;
                if (local_2a20 != (undefined1  [16])0x0) {
                  auVar68 = auVar68 ^ auVar120._0_16_;
                  auVar86 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])local_2990.hit);
                  *(undefined1 (*) [16])(local_2990.ray + 0xc0) = auVar86;
                  auVar86 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(local_2990.hit + 0x10));
                  *(undefined1 (*) [16])(local_2990.ray + 0xd0) = auVar86;
                  auVar86 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(local_2990.hit + 0x20));
                  *(undefined1 (*) [16])(local_2990.ray + 0xe0) = auVar86;
                  auVar86 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(local_2990.hit + 0x30));
                  *(undefined1 (*) [16])(local_2990.ray + 0xf0) = auVar86;
                  auVar86 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(local_2990.hit + 0x40));
                  *(undefined1 (*) [16])(local_2990.ray + 0x100) = auVar86;
                  auVar86 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(local_2990.hit + 0x50));
                  *(undefined1 (*) [16])(local_2990.ray + 0x110) = auVar86;
                  auVar86 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(local_2990.hit + 0x60));
                  *(undefined1 (*) [16])(local_2990.ray + 0x120) = auVar86;
                  auVar86 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(local_2990.hit + 0x70));
                  *(undefined1 (*) [16])(local_2990.ray + 0x130) = auVar86;
                  auVar68 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(local_2990.hit + 0x80));
                  *(undefined1 (*) [16])(local_2990.ray + 0x140) = auVar68;
                }
              }
              auVar63._8_8_ = 0x100000001;
              auVar63._0_8_ = 0x100000001;
              if ((auVar63 & auVar79) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = auVar112._0_4_;
              }
              else {
                auVar112 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              *(undefined4 *)(local_2940 + uVar58 * 4) = 0;
              uVar148 = auVar112._0_4_;
              auVar66._4_4_ = uVar148;
              auVar66._0_4_ = uVar148;
              auVar66._8_4_ = uVar148;
              auVar66._12_4_ = uVar148;
              auVar66._16_4_ = uVar148;
              auVar66._20_4_ = uVar148;
              auVar66._24_4_ = uVar148;
              auVar66._28_4_ = uVar148;
              auVar71 = vcmpps_avx(auVar67._0_32_,auVar66,2);
              local_2940 = vandps_avx(auVar71,local_2940);
            }
            auVar115 = ZEXT3264(local_2940);
            if ((((((((local_2940 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_2940 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_2940 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_2940 >> 0x7f,0) == '\0') &&
                  (local_2940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_2940 >> 0xbf,0) == '\0') &&
                (local_2940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_2940[0x1f]) goto LAB_01682a8b;
            auVar78._8_4_ = 0x7f800000;
            auVar78._0_8_ = 0x7f8000007f800000;
            auVar78._12_4_ = 0x7f800000;
            auVar78._16_4_ = 0x7f800000;
            auVar78._20_4_ = 0x7f800000;
            auVar78._24_4_ = 0x7f800000;
            auVar78._28_4_ = 0x7f800000;
            auVar71 = vblendvps_avx(auVar78,auVar67._0_32_,local_2940);
            auVar88 = vshufps_avx(auVar71,auVar71,0xb1);
            auVar88 = vminps_avx(auVar71,auVar88);
            auVar77 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar77);
            auVar77 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar77);
            auVar71 = vcmpps_avx(auVar71,auVar88,0);
            auVar88 = local_2940 & auVar71;
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar88 >> 0x7f,0) != '\0') ||
                  (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0xbf,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar88[0x1f] < '\0') {
              auVar71 = vandps_avx(auVar71,local_2940);
              auVar115 = ZEXT3264(auVar71);
            }
            goto LAB_01682636;
          }
        }
      }
LAB_01682a8b:
      auVar115 = ZEXT3264(local_23e0);
      auVar120 = ZEXT3264(local_2400);
      auVar130 = ZEXT3264(local_2420);
      auVar112 = ZEXT3264(local_2920);
      uVar58 = local_2a08;
      fVar131 = local_2440;
      fVar134 = fStack_243c;
      fVar135 = fStack_2438;
      fVar98 = fStack_2434;
      fVar103 = fStack_2430;
      fVar104 = fStack_242c;
      fVar105 = fStack_2428;
      fVar136 = local_2460;
      fVar106 = fStack_245c;
      fVar107 = fStack_2458;
      fVar108 = fStack_2454;
      fVar138 = fStack_2450;
      fVar139 = fStack_244c;
      fVar140 = fStack_2448;
      fVar141 = local_2480;
      fVar142 = fStack_247c;
      fVar143 = fStack_2478;
      fVar144 = fStack_2474;
      fVar145 = fStack_2470;
      fVar116 = fStack_246c;
      fVar121 = fStack_2468;
      fVar146 = local_24a0;
      fVar122 = fStack_249c;
      fVar123 = fStack_2498;
      fVar124 = fStack_2494;
      fVar125 = fStack_2490;
      fVar126 = fStack_248c;
      fVar147 = fStack_2488;
      fVar157 = local_24c0;
      fVar151 = fStack_24bc;
      fVar152 = fStack_24b8;
      fVar153 = fStack_24b4;
      fVar154 = fStack_24b0;
      fVar155 = fStack_24ac;
      fVar156 = fStack_24a8;
      fVar161 = local_24e0;
      fVar164 = fStack_24dc;
      fVar165 = fStack_24d8;
      fVar166 = fStack_24d4;
      fVar167 = fStack_24d0;
      fVar168 = fStack_24cc;
      fVar169 = fStack_24c8;
    }
    uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar67 = ZEXT3264(CONCAT428(uVar148,CONCAT424(uVar148,CONCAT420(uVar148,CONCAT416(uVar148,
                                                  CONCAT412(uVar148,CONCAT48(uVar148,CONCAT44(
                                                  uVar148,uVar148))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }